

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O0

void EntityRelationTask::finish(search *sch)

{
  task_data *delete_label;
  search *in_RDI;
  size_t a;
  task_data *my_task_data;
  v_array<unsigned_int> *in_stack_ffffffffffffffe0;
  example *ec;
  
  delete_label = Search::search::get_task_data<EntityRelationTask::task_data>(in_RDI);
  v_array<unsigned_int>::delete_v(in_stack_ffffffffffffffe0);
  v_array<unsigned_int>::delete_v(in_stack_ffffffffffffffe0);
  if (delete_label->search_order == 3) {
    for (ec = (example *)0x0; ec < (example *)0xa;
        ec = (example *)((long)&(ec->super_example_predict).indices._begin + 1)) {
      VW::dealloc_example((_func_void_void_ptr *)delete_label,ec,
                          (_func_void_void_ptr *)in_stack_ffffffffffffffe0);
    }
    free(delete_label->ldf_entity);
  }
  if (delete_label != (task_data *)0x0) {
    operator_delete(delete_label);
  }
  return;
}

Assistant:

void finish(Search::search& sch)
{
  task_data* my_task_data = sch.get_task_data<task_data>();
  my_task_data->y_allowed_entity.delete_v();
  my_task_data->y_allowed_relation.delete_v();
  if (my_task_data->search_order == 3)
  {
    for (size_t a = 0; a < 10; a++) VW::dealloc_example(CS::cs_label.delete_label, my_task_data->ldf_entity[a]);
    free(my_task_data->ldf_entity);
  }
  delete my_task_data;
}